

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

ON_wString __thiscall
ON_ModelComponent::ComponentTypeToString(ON_ModelComponent *this,Type component_type)

{
  undefined7 in_register_00000031;
  char *s;
  
  switch(CONCAT71(in_register_00000031,component_type) & 0xffffffff) {
  case 0:
    s = "Unset";
    break;
  case 1:
  case 0xf:
    s = "EmbeddedFile";
    break;
  case 2:
    s = "TextureMapping";
    break;
  case 3:
    s = "RenderMaterial";
    break;
  case 4:
    s = "LinePattern";
    break;
  case 5:
    s = "Layer";
    break;
  case 6:
    s = "Group";
    break;
  case 7:
    s = "TextStyle";
    break;
  case 8:
    s = "AnnotationStyle";
    break;
  case 9:
    s = "RenderLight";
    break;
  case 10:
    s = "HatchPattern";
    break;
  case 0xb:
    s = "InstanceDefinition";
    break;
  case 0xc:
    s = "ModelGeometry";
    break;
  case 0xd:
    s = "HistoryRecord";
    break;
  case 0xe:
    s = "RenderContent";
    break;
  case 0x10:
    s = "ObsoleteValue";
    break;
  case 0x11:
    s = "SectionStyle";
    break;
  default:
    if ((int)CONCAT71(in_register_00000031,component_type) != 0xfe) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x4f,"","invalid m_component_type value");
      ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
      return (ON_wString)(wchar_t *)this;
    }
    s = "Mixed";
  }
  ON_wString::ON_wString((ON_wString *)this,s);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ModelComponent::ComponentTypeToString(
  ON_ModelComponent::Type component_type
  )
{
  switch (component_type)
  {
  case ON_ModelComponent::Type::Unset:
    return ON_wString("Unset");
  case ON_ModelComponent::Type::ModelGeometry:
    return ON_wString("ModelGeometry");
  case ON_ModelComponent::Type::Image:
    return ON_wString("EmbeddedFile");
  case ON_ModelComponent::Type::LinePattern:
    return ON_wString("LinePattern");
  case ON_ModelComponent::Type::Layer:
    return ON_wString("Layer");
  case ON_ModelComponent::Type::Group:
    return ON_wString("Group");
  case ON_ModelComponent::Type::TextStyle:
    return ON_wString("TextStyle");
  case ON_ModelComponent::Type::DimStyle:
    return ON_wString("AnnotationStyle");
  case ON_ModelComponent::Type::HatchPattern:
    return ON_wString("HatchPattern");
  case ON_ModelComponent::Type::InstanceDefinition:
    return ON_wString("InstanceDefinition");
  case ON_ModelComponent::Type::HistoryRecord:
    return ON_wString("HistoryRecord");
  case ON_ModelComponent::Type::TextureMapping:
    return ON_wString("TextureMapping");
  case ON_ModelComponent::Type::Material:
    return ON_wString("RenderMaterial");
  case ON_ModelComponent::Type::RenderLight:
    return ON_wString("RenderLight");
  case ON_ModelComponent::Type::RenderContent:
    return ON_wString("RenderContent");
  case ON_ModelComponent::Type::EmbeddedFile:
    return ON_wString("EmbeddedFile");
  case ON_ModelComponent::Type::SectionStyle:
    return ON_wString("SectionStyle");
  case ON_ModelComponent::Type::ObsoleteValue:
    return ON_wString("ObsoleteValue");
  case ON_ModelComponent::Type::Mixed:
    return ON_wString("Mixed");
  default:
    ON_ERROR("invalid m_component_type value");
  }

  return ON_wString::EmptyString;
}